

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::relative_pose::modules::fivept_kneip::groebnerRow34_000000000_f
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  double factor;
  Index in_stack_fffffffffffffdf8;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *in_stack_fffffffffffffe00;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,0x1062d90);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1062db1);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1062dde);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1062e0c);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1062e30);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *pSVar2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar34,auVar64);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1062e86);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1062eaa);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *pSVar2;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar35,auVar65);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1062f00);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1062f24);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *pSVar2;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar36,auVar66);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1062f7a);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1062f9e);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *pSVar2;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar37,auVar67);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1062ff4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063018);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *pSVar2;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar38,auVar68);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x106306e);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063092);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *pSVar2;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar39,auVar69);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10630e8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x106310c);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SVar1;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *pSVar2;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar10,auVar40,auVar70);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063165);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x106318c);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SVar1;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *pSVar2;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar11,auVar41,auVar71);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10631eb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063212);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SVar1;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *pSVar2;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar12,auVar42,auVar72);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063271);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063298);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SVar1;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *pSVar2;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar13,auVar43,auVar73);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10632f7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x106331e);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = SVar1;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *pSVar2;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar14,auVar44,auVar74);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x106337d);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10633a4);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = SVar1;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *pSVar2;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar15,auVar45,auVar75);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063403);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x106342a);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = SVar1;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *pSVar2;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar16,auVar46,auVar76);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063489);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10634b0);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = SVar1;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *pSVar2;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar17,auVar47,auVar77);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x106350f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063536);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = SVar1;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *pSVar2;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar18,auVar48,auVar78);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063595);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10635bc);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = SVar1;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *pSVar2;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar19,auVar49,auVar79);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x106361b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063642);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = SVar1;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *pSVar2;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar20,auVar50,auVar80);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10636a1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10636c8);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = SVar1;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *pSVar2;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar21,auVar51,auVar81);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063727);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x106374e);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = SVar1;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *pSVar2;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar22,auVar52,auVar82);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10637ad);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10637d4);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = SVar1;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *pSVar2;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar23,auVar53,auVar83);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063833);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x106385a);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = SVar1;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *pSVar2;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar24,auVar54,auVar84);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10638b9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10638e0);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = SVar1;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *pSVar2;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar25,auVar55,auVar85);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x106393f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063966);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = SVar1;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *pSVar2;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar26,auVar56,auVar86);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10639c5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x10639ec);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = SVar1;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *pSVar2;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar27,auVar57,auVar87);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063a4b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063a72);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = SVar1;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *pSVar2;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar28,auVar58,auVar88);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063ad1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063af8);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = SVar1;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *pSVar2;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar29,auVar59,auVar89);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063b57);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063b7e);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = SVar1;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *pSVar2;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar30,auVar60,auVar90);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063bdd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063c04);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = SVar1;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *pSVar2;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar31,auVar61,auVar91);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063c63);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063c8a);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = SVar1;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *pSVar2;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar32,auVar62,auVar92);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063ce9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffdf8,0x1063d10);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = SVar1;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *pSVar2;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar33,auVar63,auVar93);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::groebnerRow34_000000000_f( Eigen::Matrix<double,66,197> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,157) / groebnerMatrix(34,157);
  groebnerMatrix(targetRow,157) = 0.0;
  groebnerMatrix(targetRow,158) -= factor * groebnerMatrix(34,158);
  groebnerMatrix(targetRow,159) -= factor * groebnerMatrix(34,159);
  groebnerMatrix(targetRow,160) -= factor * groebnerMatrix(34,160);
  groebnerMatrix(targetRow,161) -= factor * groebnerMatrix(34,161);
  groebnerMatrix(targetRow,162) -= factor * groebnerMatrix(34,162);
  groebnerMatrix(targetRow,170) -= factor * groebnerMatrix(34,170);
  groebnerMatrix(targetRow,171) -= factor * groebnerMatrix(34,171);
  groebnerMatrix(targetRow,173) -= factor * groebnerMatrix(34,173);
  groebnerMatrix(targetRow,174) -= factor * groebnerMatrix(34,174);
  groebnerMatrix(targetRow,176) -= factor * groebnerMatrix(34,176);
  groebnerMatrix(targetRow,177) -= factor * groebnerMatrix(34,177);
  groebnerMatrix(targetRow,178) -= factor * groebnerMatrix(34,178);
  groebnerMatrix(targetRow,179) -= factor * groebnerMatrix(34,179);
  groebnerMatrix(targetRow,180) -= factor * groebnerMatrix(34,180);
  groebnerMatrix(targetRow,181) -= factor * groebnerMatrix(34,181);
  groebnerMatrix(targetRow,182) -= factor * groebnerMatrix(34,182);
  groebnerMatrix(targetRow,183) -= factor * groebnerMatrix(34,183);
  groebnerMatrix(targetRow,184) -= factor * groebnerMatrix(34,184);
  groebnerMatrix(targetRow,185) -= factor * groebnerMatrix(34,185);
  groebnerMatrix(targetRow,186) -= factor * groebnerMatrix(34,186);
  groebnerMatrix(targetRow,187) -= factor * groebnerMatrix(34,187);
  groebnerMatrix(targetRow,188) -= factor * groebnerMatrix(34,188);
  groebnerMatrix(targetRow,189) -= factor * groebnerMatrix(34,189);
  groebnerMatrix(targetRow,190) -= factor * groebnerMatrix(34,190);
  groebnerMatrix(targetRow,191) -= factor * groebnerMatrix(34,191);
  groebnerMatrix(targetRow,192) -= factor * groebnerMatrix(34,192);
  groebnerMatrix(targetRow,193) -= factor * groebnerMatrix(34,193);
  groebnerMatrix(targetRow,194) -= factor * groebnerMatrix(34,194);
  groebnerMatrix(targetRow,195) -= factor * groebnerMatrix(34,195);
  groebnerMatrix(targetRow,196) -= factor * groebnerMatrix(34,196);
}